

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O3

int __thiscall hwnet::util::TimerMgr::remove(TimerMgr *this,char *__filename)

{
  Timer *pTVar1;
  ulong uVar2;
  ulong uVar3;
  Timer *pTVar4;
  Timer *e;
  int iVar5;
  size_t sVar6;
  pointer ppTVar7;
  long lVar8;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  pTVar1 = *(Timer **)__filename;
  if (((pTVar1->mMgr == this) && (uVar2 = pTVar1->mIndex, uVar2 != 0)) &&
     (uVar3 = this->elements_size, uVar2 <= uVar3)) {
    ppTVar7 = (this->elements).
              super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pTVar4 = ppTVar7[uVar2 - 1];
    if (pTVar4 == pTVar1) {
      e = ppTVar7[uVar3 - 1];
      sVar6 = uVar3 - 1;
      if (e == pTVar1) {
        this->elements_size = sVar6;
      }
      else {
        uVar3 = e->mIndex;
        if (uVar2 != uVar3) {
          ppTVar7[uVar2 - 1] = ppTVar7[uVar3 - 1];
          (this->elements).
          super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3 - 1] = pTVar4;
          ppTVar7 = (this->elements).
                    super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppTVar7[uVar2 - 1]->mIndex = uVar2;
          ppTVar7[uVar3 - 1]->mIndex = uVar3;
        }
        this->elements_size = sVar6;
        change(this,e);
        sVar6 = this->elements_size;
        ppTVar7 = (this->elements).
                  super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      }
      ppTVar7[sVar6] = (Timer *)0x0;
      lVar8 = *(long *)__filename;
      *(undefined8 *)(lVar8 + 0x50) = 0;
      if (*(code **)(lVar8 + 0x20) != (code *)0x0) {
        (**(code **)(lVar8 + 0x20))(lVar8 + 0x10,lVar8 + 0x10,3);
        *(undefined8 *)(lVar8 + 0x20) = 0;
        *(undefined8 *)(lVar8 + 0x28) = 0;
        lVar8 = *(long *)__filename;
      }
      *(long *)(lVar8 + 0x68) = lVar8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar8 + 0x70),
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(__filename + 8));
      iVar5 = (int)CONCAT71((int7)((ulong)(__filename + 8) >> 8),1);
      goto LAB_0011fca8;
    }
  }
  iVar5 = 0;
LAB_0011fca8:
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return iVar5;
}

Assistant:

bool remove(Timer::Ptr &e) {
		std::lock_guard<std::mutex> guard(this->mtx);
		if(this == e->mMgr) {
			if(e->mIndex == 0 || e->mIndex > this->elements_size) {
				return false;
			}

			auto offsetIdx = getOffset(e->mIndex);
			if(this->elements[offsetIdx] != e.get()) {
				return false;
			}

			auto tail = this->elements[this->elements_size-1];
			
			if(tail == e.get()) {
				this->elements_size--;
			} else {
				this->swap(e->mIndex,tail->mIndex);
				this->elements_size--;
				this->change(tail);
			}

			this->elements[this->elements_size] = nullptr;
			e->mIndex = 0;
			e->mCallback = nullptr;
			e->selfPtr = e;
			return true;
		} else {
			return false;
		} 
	}